

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_componentEqualDifferentOrderComponents_Test::
~Equality_componentEqualDifferentOrderComponents_Test
          (Equality_componentEqualDifferentOrderComponents_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, componentEqualDifferentOrderComponents)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::ComponentPtr cChild1 = libcellml::Component::create("child1");
    libcellml::ComponentPtr cChild2 = libcellml::Component::create("child2");
    libcellml::ComponentPtr cChild3 = libcellml::Component::create("child3");
    libcellml::ComponentPtr cChild4 = libcellml::Component::create("child1");
    libcellml::ComponentPtr cChild5 = libcellml::Component::create("child2");
    libcellml::ComponentPtr cChild6 = libcellml::Component::create("child3");

    c1->addComponent(cChild1);
    c1->addComponent(cChild2);
    c1->addComponent(cChild3);

    c2->addComponent(cChild5);
    c2->addComponent(cChild6);
    c2->addComponent(cChild4);

    EXPECT_TRUE(c1->equals(c2));
    EXPECT_TRUE(c2->equals(c1));
}